

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O2

SCC * __thiscall
google::protobuf::compiler::
SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::GetSCC
          (SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *this,
          Descriptor *descriptor)

{
  size_type sVar1;
  mapped_type *pmVar2;
  SCC *pSVar3;
  NodeData NVar4;
  Descriptor *local_18;
  
  local_18 = descriptor;
  sVar1 = std::
          map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
          ::count(&this->cache_,&local_18);
  if (sVar1 == 0) {
    NVar4 = DFS(this,descriptor);
    pSVar3 = NVar4.scc;
  }
  else {
    pmVar2 = std::
             map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
             ::operator[](&this->cache_,&local_18);
    pSVar3 = pmVar2->scc;
  }
  return pSVar3;
}

Assistant:

const SCC* GetSCC(const Descriptor* descriptor) {
    if (cache_.count(descriptor)) return cache_[descriptor].scc;
    return DFS(descriptor).scc;
  }